

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Menu.cpp
# Opt level: O0

void __thiscall Menu::display(Menu *this)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  size_type sVar4;
  reference pvVar5;
  int local_1c;
  int i;
  Menu *this_local;
  
  line(0x23,'-');
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::left);
  _Var2 = std::setw(0x23);
  poVar3 = std::operator<<(poVar3,_Var2);
  _Var1 = std::setfill<char>(' ');
  poVar3 = std::operator<<(poVar3,_Var1._M_c);
  poVar3 = std::operator<<(poVar3,(string *)this);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  line(0x23,'-');
  local_1c = 1;
  while( true ) {
    sVar4 = std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
            ::size(&this->options);
    if (sVar4 <= (ulong)(long)local_1c) break;
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_1c);
    poVar3 = std::operator<<(poVar3,". ");
    pvVar5 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
             ::at(&this->options,(long)local_1c);
    poVar3 = std::operator<<(poVar3,(string *)pvVar5);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_1c = local_1c + 1;
  }
  poVar3 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"0. ");
  pvVar5 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
           ::at(&this->options,0);
  poVar3 = std::operator<<(poVar3,(string *)pvVar5);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Menu::display() {
    line(35);
    cout << left << setw(35) << setfill(' ') << name << endl;
    line(35);
    for (int i = 1; i < options.size(); i++) {
        cout << i << ". " << options.at(i).first << endl;
    }
    // Por convenção, a opção 0 é sempre fechar/voltar
    cout << endl << "0. " << options.at(0).first << endl;
}